

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O3

long hw_cpu_min_freq(void)

{
  int iVar1;
  long lVar2;
  char sys_devices_system_cpu [32];
  stat struct_stat;
  char acStack_b8 [32];
  stat local_98;
  
  iVar1 = stat("/sys/devices/system/cpu/cpu0/cpufreq/scaling_min_freq",&local_98);
  lVar2 = -1;
  if (iVar1 == 0) {
    iVar1 = slurpfile("/sys/devices/system/cpu/cpu0/cpufreq/scaling_min_freq",acStack_b8,0x20);
    if (iVar1 != 0) {
      lVar2 = strtol(acStack_b8,(char **)0x0,10);
      lVar2 = lVar2 / 1000;
    }
  }
  return lVar2;
}

Assistant:

long hw_cpu_min_freq( void )
{
  long val = -1;
#ifdef HAVE_MAC_SYSCTL
  size_t vlen;
  vlen = sizeof(long);
  sysctlbyname("hw.cpufrequency_min",&val,&vlen,NULL,0);
  val = val/1e6;

#else
  char *p;

  struct stat struct_stat;
  char sys_devices_system_cpu[32];
  const char *CPU_FREQ_SCALING_MIN_FREQ = "/sys/devices/system/cpu/cpu0/cpufreq/scaling_min_freq";
  if ( stat(CPU_FREQ_SCALING_MIN_FREQ, &struct_stat) == 0 ) {
    if(slurpfile(CPU_FREQ_SCALING_MIN_FREQ, sys_devices_system_cpu, 32)) {
      p = sys_devices_system_cpu;
      val = (strtol( p, (char **)NULL , 10 ) / 1000 );
    }
  }
#endif //end HAVE_MAC_SYSCTL
  return val;
}